

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.h
# Opt level: O1

void __thiscall
lunasvg::SVGElement::
transverse<lunasvg::Document::querySelectorAll(std::__cxx11::string_const&)const::__0>
          (SVGElement *this,anon_class_16_2_c48942ba callback)

{
  Selector *pSVar1;
  bool bVar2;
  int iVar3;
  Selector *selector;
  SVGElement *this_00;
  _List_node_base *p_Var4;
  SelectorList *__range2;
  Element local_30;
  
  pSVar1 = ((callback.selectors)->
           super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (selector = ((callback.selectors)->
                  super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; selector != pSVar1;
      selector = selector + 1) {
    bVar2 = matchSelector(selector,this);
    if (bVar2) {
      Element::Element(&local_30,this);
      std::vector<lunasvg::Element,_std::allocator<lunasvg::Element>_>::
      emplace_back<lunasvg::Element>(callback.elements,&local_30);
      break;
    }
  }
  p_Var4 = (this->m_children).
           super__List_base<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>,_std::allocator<std::unique_ptr<lunasvg::SVGNode,_std::default_delete<lunasvg::SVGNode>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var4 == (_List_node_base *)&this->m_children) {
      return;
    }
    this_00 = (SVGElement *)p_Var4[1]._M_next;
    if (this_00 == (SVGElement *)0x0) {
LAB_0011b068:
      this_00 = (SVGElement *)0x0;
    }
    else {
      iVar3 = (*(code *)((_List_node_base *)(this_00->super_SVGNode)._vptr_SVGNode)[1]._M_prev)
                        (this_00);
      if ((char)iVar3 == '\0') goto LAB_0011b068;
    }
    if (this_00 != (SVGElement *)0x0) {
      transverse<lunasvg::Document::querySelectorAll(std::__cxx11::string_const&)const::__0>
                (this_00,callback);
    }
    p_Var4 = p_Var4->_M_next;
  } while( true );
}

Assistant:

inline void SVGElement::transverse(T callback)
{
    callback(this);
    for(const auto& child : m_children) {
        if(auto element = toSVGElement(child)) {
            element->transverse(callback);
        }
    }
}